

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_generator_generate_internal
              (secp256k1_context *ctx,secp256k1_generator *gen,uchar *key32,uchar *blind32)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int overflow;
  secp256k1_fe local_1b8;
  secp256k1_ge add;
  secp256k1_gej accum;
  uchar b32 [32];
  secp256k1_scalar blind;
  
  local_1b8.n[3] = 0;
  local_1b8.n[4] = 0;
  local_1b8.n[1] = 0;
  local_1b8.n[2] = 0;
  local_1b8.n[0] = 4;
  if (blind32 == (uchar *)0x0) {
    uVar3 = 1;
  }
  else {
    secp256k1_scalar_set_b32(&blind,blind32,&overflow);
    uVar3 = (uint)(overflow == 0);
    secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx,&accum,&blind);
  }
  blind.d[0] = 0xbb67ae856a09e667;
  blind.d[1] = 0xa54ff53a3c6ef372;
  blind.d[2] = 0x9b05688c510e527f;
  blind.d[3] = 0x5be0cd191f83d9ab;
  secp256k1_sha256_write((secp256k1_sha256 *)&blind,"1st generation: ",0x10);
  secp256k1_sha256_write((secp256k1_sha256 *)&blind,key32,0x20);
  secp256k1_sha256_finalize((secp256k1_sha256 *)&blind,b32);
  uVar1 = secp256k1_fe_set_b32(&local_1b8,b32);
  shallue_van_de_woestijne(&add,&local_1b8);
  if (blind32 == (uchar *)0x0) {
    accum.infinity = add.infinity;
    accum.x.n[0] = add.x.n[0];
    accum.x.n[1] = add.x.n[1];
    accum.x.n[2] = add.x.n[2];
    accum.x.n[3] = add.x.n[3];
    accum.x.n[4] = add.x.n[4];
    accum.y.n[0] = add.y.n[0];
    accum.y.n[1] = add.y.n[1];
    accum.y.n[2] = add.y.n[2];
    accum.y.n[3] = add.y.n[3];
    accum.y.n[4] = add.y.n[4];
    accum.z.n[0] = 1;
    accum.z.n[1] = 0;
    accum.z.n[2] = 0;
    accum.z.n[3] = 0;
    accum.z.n[4] = 0;
  }
  else {
    secp256k1_gej_add_ge(&accum,&accum,&add);
  }
  blind.d[0] = 0xbb67ae856a09e667;
  blind.d[1] = 0xa54ff53a3c6ef372;
  blind.d[2] = 0x9b05688c510e527f;
  blind.d[3] = 0x5be0cd191f83d9ab;
  secp256k1_sha256_write((secp256k1_sha256 *)&blind,"2nd generation: ",0x10);
  secp256k1_sha256_write((secp256k1_sha256 *)&blind,key32,0x20);
  secp256k1_sha256_finalize((secp256k1_sha256 *)&blind,b32);
  uVar2 = secp256k1_fe_set_b32(&local_1b8,b32);
  shallue_van_de_woestijne(&add,&local_1b8);
  secp256k1_gej_add_ge(&accum,&accum,&add);
  secp256k1_ge_set_gej(&add,&accum);
  secp256k1_generator_save(gen,&add);
  return uVar2 & uVar1 & uVar3;
}

Assistant:

static int secp256k1_generator_generate_internal(const secp256k1_context* ctx, secp256k1_generator* gen, const unsigned char *key32, const unsigned char *blind32) {
    static const unsigned char prefix1[17] = "1st generation: ";
    static const unsigned char prefix2[17] = "2nd generation: ";
    secp256k1_fe t = SECP256K1_FE_CONST(0, 0, 0, 0, 0, 0, 0, 4);
    secp256k1_ge add;
    secp256k1_gej accum;
    int overflow;
    secp256k1_sha256 sha256;
    unsigned char b32[32];
    int ret = 1;

    if (blind32) {
        secp256k1_scalar blind;
        secp256k1_scalar_set_b32(&blind, blind32, &overflow);
        ret = !overflow;
        secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx, &accum, &blind);
    }

    secp256k1_sha256_initialize(&sha256);
    secp256k1_sha256_write(&sha256, prefix1, 16);
    secp256k1_sha256_write(&sha256, key32, 32);
    secp256k1_sha256_finalize(&sha256, b32);
    ret &= secp256k1_fe_set_b32(&t, b32);
    shallue_van_de_woestijne(&add, &t);
    if (blind32) {
        secp256k1_gej_add_ge(&accum, &accum, &add);
    } else {
        secp256k1_gej_set_ge(&accum, &add);
    }

    secp256k1_sha256_initialize(&sha256);
    secp256k1_sha256_write(&sha256, prefix2, 16);
    secp256k1_sha256_write(&sha256, key32, 32);
    secp256k1_sha256_finalize(&sha256, b32);
    ret &= secp256k1_fe_set_b32(&t, b32);
    shallue_van_de_woestijne(&add, &t);
    secp256k1_gej_add_ge(&accum, &accum, &add);

    secp256k1_ge_set_gej(&add, &accum);
    secp256k1_generator_save(gen, &add);
    return ret;
}